

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_struct_member
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t member_type_id,
          uint32_t index,string *qualifier)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  char cVar13;
  uint32_t uVar14;
  ID id;
  BaseType BVar15;
  ExecutionModel EVar16;
  SPIRType *pSVar17;
  undefined8 *puVar18;
  long *plVar19;
  SPIRVariable *pSVar20;
  SPIRType *pSVar21;
  runtime_error *this_00;
  undefined4 uVar22;
  ulong *puVar23;
  size_type *psVar24;
  uint uVar25;
  uint uVar26;
  SPIRType *pSVar27;
  char *pcVar28;
  ulong uVar29;
  undefined8 uVar30;
  char (*ts_2) [2];
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar31;
  string decl_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  char *overlapping_binding_tag;
  size_type local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_398;
  string *local_390;
  string array_type;
  string __str;
  string __str_1;
  string pack_pfx;
  string base_type;
  uint *local_2d0;
  uint local_2b8 [8];
  bool *local_298;
  size_t local_290;
  bool local_280 [40];
  TypedID<(spirv_cross::Types)1> *local_258;
  size_t local_250;
  TypedID<(spirv_cross::Types)1> local_240 [8];
  uint *local_220;
  size_t local_218;
  uint local_208 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1c8;
  undefined1 local_190 [208];
  SmallVector<unsigned_int,_8UL> local_c0;
  ImageType local_88;
  TypeID TStack_70;
  TypeID TStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  undefined1 local_40 [16];
  
  local_390 = __return_storage_ptr__;
  bVar11 = CompilerGLSL::member_is_remapped_physical_type(&this->super_CompilerGLSL,type,index);
  uVar14 = member_type_id;
  if (bVar11) {
    uVar14 = Compiler::get_extended_member_decoration
                       ((Compiler *)this,(type->super_IVariant).self.id,index,
                        SPIRVCrossDecorationPhysicalTypeID);
  }
  pSVar17 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + uVar14);
  pack_pfx._M_dataplus._M_p = (pointer)&pack_pfx.field_2;
  pack_pfx._M_string_length = 0;
  pack_pfx.field_2._M_local_buf[0] = '\0';
  bVar11 = Compiler::has_extended_member_decoration
                     ((Compiler *)this,(type->super_IVariant).self.id,index,
                      SPIRVCrossDecorationInterfaceOrigID);
  id.id = 0;
  if (bVar11) {
    id.id = Compiler::get_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationInterfaceOrigID);
  }
  bVar12 = Compiler::is_matrix((Compiler *)this,pSVar17);
  bVar11 = false;
  if (bVar12) {
    bVar11 = Compiler::has_member_decoration
                       ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                        DecorationRowMajor);
  }
  local_190._32_8_ = local_190 + 0x38;
  local_190._0_8_ = &PTR__SPIRType_0035c188;
  local_190._8_4_ = 0;
  local_190._12_4_ = 0x18;
  local_190._16_4_ = Unknown;
  local_190._20_4_ = 0;
  local_190._24_4_ = 1;
  local_190._28_4_ = 1;
  local_190._40_8_ = 0;
  local_190._48_8_ = 8;
  local_190._88_8_ = local_190 + 0x70;
  local_190._96_8_ = 0;
  local_190._104_8_ = 8;
  local_190._120_8_ = (ulong)(ushort)local_190._126_2_ << 0x30;
  local_190._128_4_ = 0;
  local_190._132_4_ = 0;
  local_190._136_4_ = 0;
  local_190._140_4_ = 0;
  local_190._144_4_ = StorageClassGeneric;
  local_190._152_8_ = local_190 + 0xb0;
  local_190._160_8_ = 0;
  local_190._168_8_ = 8;
  local_c0.super_VectorView<unsigned_int>.ptr = (uint *)&local_c0.stack_storage;
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  local_c0.buffer_capacity = 8;
  local_68._0_8_ = local_40 + 8;
  local_88._0_7_ = 0;
  local_88._7_4_ = 0;
  TStack_6c.id = 0;
  local_88.sampled = 0;
  local_88.format = ImageFormatUnknown;
  local_88.access = AccessQualifierReadOnly;
  TStack_70.id = 0;
  local_68._8_8_ = 1;
  local_58 = (undefined1  [16])0x0;
  local_48 = 1.0;
  local_40 = (undefined1  [16])0x0;
  bVar12 = Compiler::has_member_decoration
                     ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationOffset
                     );
  if ((bVar12) ||
     (bVar12 = Compiler::has_extended_member_decoration
                         ((Compiler *)this,(type->super_IVariant).self.id,index,
                          SPIRVCrossDecorationResourceIndexPrimary), bVar12)) {
    this->is_using_builtin_array = true;
  }
  bVar12 = CompilerGLSL::member_is_packed_physical_type(&this->super_CompilerGLSL,type,index);
  pSVar27 = pSVar17;
  if (bVar12) {
    if (pSVar17->basetype == Struct) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Cannot emit a packed struct currently.");
      goto LAB_00225dd9;
    }
    bVar12 = Compiler::is_matrix((Compiler *)this,pSVar17);
    if (!bVar12) {
      bVar12 = Compiler::is_scalar((Compiler *)this,pSVar17);
      if (!bVar12) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x2b84b6);
      }
      goto LAB_00225461;
    }
    uVar14 = pSVar17->vecsize;
    local_398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_398._4_4_,pSVar17->columns);
    ::std::__cxx11::string::_M_replace
              ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x2b84b6);
    if (bVar11 != false) {
      local_398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_398._4_4_,pSVar17->vecsize);
      uVar14 = pSVar17->columns;
      ::std::__cxx11::string::_M_replace
                ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x2d0c90);
    }
    bVar12 = pSVar17->width == 0x10;
    pcVar28 = "float";
    if (bVar12) {
      pcVar28 = "half";
    }
    base_type._M_dataplus._M_p = (pointer)&base_type.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&base_type,pcVar28,pcVar28 + ((ulong)bVar12 ^ 5));
    array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&array_type,"typedef ","");
    ::std::operator+(&local_3d8,"packed_",&base_type);
    cVar13 = '\x01';
    if (9 < uVar14) {
      uVar29 = (ulong)uVar14;
      cVar10 = '\x04';
      do {
        cVar13 = cVar10;
        uVar25 = (uint)uVar29;
        if (uVar25 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_00224e2b;
        }
        if (uVar25 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_00224e2b;
        }
        if (uVar25 < 10000) goto LAB_00224e2b;
        uVar29 = uVar29 / 10000;
        cVar10 = cVar13 + '\x04';
      } while (99999 < uVar25);
      cVar13 = cVar13 + '\x01';
    }
LAB_00224e2b:
    overlapping_binding_tag = (char *)&local_3a8;
    ::std::__cxx11::string::_M_construct((ulong)&overlapping_binding_tag,cVar13);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (overlapping_binding_tag,(uint)local_3b0,uVar14);
    uVar30 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      uVar30 = local_3d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar30 < local_3b0 + local_3d8._M_string_length) {
      uVar30 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)overlapping_binding_tag != &local_3a8) {
        uVar30 = local_3a8._M_allocated_capacity;
      }
      if ((ulong)uVar30 < local_3b0 + local_3d8._M_string_length) goto LAB_00224e9a;
      puVar18 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&overlapping_binding_tag,0,(char *)0x0,
                           (ulong)local_3d8._M_dataplus._M_p);
    }
    else {
LAB_00224e9a:
      puVar18 = (undefined8 *)
                ::std::__cxx11::string::_M_append((char *)&local_3d8,(ulong)overlapping_binding_tag)
      ;
    }
    decl_type._M_dataplus._M_p = (pointer)&decl_type.field_2;
    psVar24 = puVar18 + 2;
    if ((size_type *)*puVar18 == psVar24) {
      decl_type.field_2._M_allocated_capacity = *psVar24;
      decl_type.field_2._8_8_ = puVar18[3];
    }
    else {
      decl_type.field_2._M_allocated_capacity = *psVar24;
      decl_type._M_dataplus._M_p = (pointer)*puVar18;
    }
    decl_type._M_string_length = puVar18[1];
    *puVar18 = psVar24;
    puVar18[1] = 0;
    *(char *)psVar24 = '\0';
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)overlapping_binding_tag != &local_3a8) {
      operator_delete(overlapping_binding_tag);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p);
    }
    ::std::operator+(&decl_type," ",&pack_pfx);
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    uVar25 = pSVar17->columns;
    cVar13 = '\x01';
    if (9 < uVar25) {
      uVar26 = uVar25;
      cVar10 = '\x04';
      do {
        cVar13 = cVar10;
        if (uVar26 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_00224fd5;
        }
        if (uVar26 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_00224fd5;
        }
        if (uVar26 < 10000) goto LAB_00224fd5;
        bVar12 = 99999 < uVar26;
        uVar26 = uVar26 / 10000;
        cVar10 = cVar13 + '\x04';
      } while (bVar12);
      cVar13 = cVar13 + '\x01';
    }
LAB_00224fd5:
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&__str,cVar13);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar25);
    plVar19 = (long *)::std::__cxx11::string::replace
                                ((ulong)&__str,0,(char *)0x0,(ulong)base_type._M_dataplus._M_p);
    overlapping_binding_tag = (char *)&local_3a8;
    puVar23 = (ulong *)(plVar19 + 2);
    if ((ulong *)*plVar19 == puVar23) {
      local_3a8._M_allocated_capacity = *puVar23;
      local_3a8._8_8_ = plVar19[3];
    }
    else {
      local_3a8._M_allocated_capacity = *puVar23;
      overlapping_binding_tag = (char *)*plVar19;
    }
    local_3b0 = plVar19[1];
    *plVar19 = (long)puVar23;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)::std::__cxx11::string::append((char *)&overlapping_binding_tag);
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    puVar23 = (ulong *)(plVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar19 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar23) {
      local_3d8.field_2._M_allocated_capacity = *puVar23;
      local_3d8.field_2._8_8_ = plVar19[3];
    }
    else {
      local_3d8.field_2._M_allocated_capacity = *puVar23;
      local_3d8._M_dataplus._M_p = (pointer)*plVar19;
    }
    local_3d8._M_string_length = plVar19[1];
    *plVar19 = (long)puVar23;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    uVar25 = pSVar17->vecsize;
    cVar13 = '\x01';
    if (9 < uVar25) {
      uVar26 = uVar25;
      cVar10 = '\x04';
      do {
        cVar13 = cVar10;
        if (uVar26 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_0022511f;
        }
        if (uVar26 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_0022511f;
        }
        if (uVar26 < 10000) goto LAB_0022511f;
        bVar12 = 99999 < uVar26;
        uVar26 = uVar26 / 10000;
        cVar10 = cVar13 + '\x04';
      } while (bVar12);
      cVar13 = cVar13 + '\x01';
    }
LAB_0022511f:
    paVar1 = &__str_1.field_2;
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar13);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar25);
    uVar29 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
             local_3d8._M_string_length;
    uVar30 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      uVar30 = local_3d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar30 < uVar29) {
      uVar30 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        uVar30 = __str_1.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar30 < uVar29) goto LAB_002251a5;
      puVar18 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&__str_1,0,(char *)0x0,(ulong)local_3d8._M_dataplus._M_p);
    }
    else {
LAB_002251a5:
      puVar18 = (undefined8 *)
                ::std::__cxx11::string::_M_append
                          ((char *)&local_3d8,(ulong)__str_1._M_dataplus._M_p);
    }
    psVar24 = puVar18 + 2;
    if ((size_type *)*puVar18 == psVar24) {
      decl_type.field_2._M_allocated_capacity = *psVar24;
      decl_type.field_2._8_8_ = puVar18[3];
      decl_type._M_dataplus._M_p = (pointer)&decl_type.field_2;
    }
    else {
      decl_type.field_2._M_allocated_capacity = *psVar24;
      decl_type._M_dataplus._M_p = (pointer)*puVar18;
    }
    decl_type._M_string_length = puVar18[1];
    *puVar18 = psVar24;
    puVar18[1] = 0;
    *(char *)psVar24 = '\0';
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)overlapping_binding_tag != &local_3a8) {
      operator_delete(overlapping_binding_tag);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p);
    }
    cVar13 = '\x01';
    if (9 < (uint)local_398) {
      uVar25 = (uint)local_398;
      cVar10 = '\x04';
      do {
        cVar13 = cVar10;
        if (uVar25 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_002252d4;
        }
        if (uVar25 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_002252d4;
        }
        if (uVar25 < 10000) goto LAB_002252d4;
        bVar12 = 99999 < uVar25;
        uVar25 = uVar25 / 10000;
        cVar10 = cVar13 + '\x04';
      } while (bVar12);
      cVar13 = cVar13 + '\x01';
    }
LAB_002252d4:
    overlapping_binding_tag = (char *)&local_3a8;
    ::std::__cxx11::string::_M_construct((ulong)&overlapping_binding_tag,cVar13);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (overlapping_binding_tag,(uint)local_3b0,(uint)local_398);
    plVar19 = (long *)::std::__cxx11::string::replace
                                ((ulong)&overlapping_binding_tag,0,(char *)0x0,0x2be9ba);
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    puVar23 = (ulong *)(plVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar19 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar23) {
      local_3d8.field_2._M_allocated_capacity = *puVar23;
      local_3d8.field_2._8_8_ = plVar19[3];
    }
    else {
      local_3d8.field_2._M_allocated_capacity = *puVar23;
      local_3d8._M_dataplus._M_p = (pointer)*plVar19;
    }
    local_3d8._M_string_length = plVar19[1];
    *plVar19 = (long)puVar23;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)::std::__cxx11::string::append((char *)&local_3d8);
    psVar24 = (size_type *)(plVar19 + 2);
    if ((size_type *)*plVar19 == psVar24) {
      decl_type.field_2._M_allocated_capacity = *psVar24;
      decl_type.field_2._8_8_ = plVar19[3];
      decl_type._M_dataplus._M_p = (pointer)&decl_type.field_2;
    }
    else {
      decl_type.field_2._M_allocated_capacity = *psVar24;
      decl_type._M_dataplus._M_p = (pointer)*plVar19;
    }
    decl_type._M_string_length = plVar19[1];
    *plVar19 = (long)psVar24;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)overlapping_binding_tag != &local_3a8) {
      operator_delete(overlapping_binding_tag);
    }
    ::std::__cxx11::string::append((char *)&array_type);
    pVar31 = ::std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string_const&>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&this->typedef_lines,&array_type);
    if (((undefined1  [16])pVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      Compiler::force_recompile((Compiler *)this);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)array_type._M_dataplus._M_p != &array_type.field_2) {
      operator_delete(array_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)base_type._M_dataplus._M_p != &base_type.field_2) {
      operator_delete(base_type._M_dataplus._M_p);
    }
  }
  else {
    bVar12 = Compiler::is_matrix((Compiler *)this,pSVar17);
    if (bVar12) {
      if (((this->msl_options).msl_version < 30000) &&
         (bVar12 = Compiler::has_extended_decoration
                             ((Compiler *)this,(type->super_IVariant).self.id,
                              SPIRVCrossDecorationWorkgroupStruct), bVar12)) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x2d0ca4);
        add_spv_func_and_recompile(this,SPVFuncImplStorageMatrix);
        this->is_using_builtin_array = true;
      }
      if (bVar11 != false) {
        local_190._8_4_ = (pSVar17->super_IVariant).self.id;
        local_190._28_4_ = pSVar17->columns;
        uVar30 = *(undefined8 *)&(pSVar17->super_IVariant).field_0xc;
        uVar2 = pSVar17->width;
        uVar3 = pSVar17->vecsize;
        local_190._12_4_ = (undefined4)uVar30;
        local_190._16_4_ = (undefined4)((ulong)uVar30 >> 0x20);
        local_190._20_4_ = uVar2;
        local_190._24_4_ = uVar3;
        SmallVector<unsigned_int,_8UL>::operator=
                  ((SmallVector<unsigned_int,_8UL> *)(local_190 + 0x20),&pSVar17->array);
        SmallVector<bool,_8UL>::operator=
                  ((SmallVector<bool,_8UL> *)(local_190 + 0x58),&pSVar17->array_size_literal);
        local_190._120_4_ = pSVar17->pointer_depth;
        local_190[0x7c] = pSVar17->pointer;
        local_190[0x7d] = pSVar17->forward_pointer;
        local_190._126_2_ = *(undefined2 *)&pSVar17->field_0x7e;
        uVar4 = (pSVar17->cooperative).use_id;
        uVar5 = (pSVar17->cooperative).rows_id;
        uVar6 = (pSVar17->cooperative).columns_id;
        uVar30 = *(undefined8 *)&(pSVar17->cooperative).scope_id;
        local_190._140_4_ = (undefined4)uVar30;
        local_190._144_4_ = (undefined4)((ulong)uVar30 >> 0x20);
        local_190._128_4_ = uVar4;
        local_190._132_4_ = uVar5;
        local_190._136_4_ = uVar6;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                   (local_190 + 0x98),&pSVar17->member_types);
        SmallVector<unsigned_int,_8UL>::operator=(&local_c0,&pSVar17->member_type_index_redirection)
        ;
        uVar30._0_4_ = (pSVar17->image).type;
        uVar30._4_4_ = (pSVar17->image).dim;
        uVar7._0_1_ = (pSVar17->image).depth;
        uVar7._1_1_ = (pSVar17->image).arrayed;
        uVar7._2_1_ = (pSVar17->image).ms;
        uVar7._3_1_ = (pSVar17->image).field_0xb;
        uVar7._4_4_ = (pSVar17->image).sampled;
        local_88.format = (pSVar17->image).format;
        local_88.access = (pSVar17->image).access;
        uVar8 = pSVar17->type_alias;
        uVar9 = pSVar17->parent_type;
        local_88._0_7_ = SUB87(uVar30,0);
        local_88.dim._3_1_ = (undefined1)((uint)uVar30._4_4_ >> 0x18);
        local_88._8_3_ = SUB83(uVar7,0);
        local_88._11_1_ = uVar7._3_1_;
        local_88.sampled = uVar7._4_4_;
        TStack_70.id = uVar8;
        TStack_6c.id = uVar9;
        if (pSVar17 != (SPIRType *)local_190) {
          ::std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_68,&(pSVar17->member_name_cache)._M_h);
        }
        uVar22 = local_190._24_4_;
        local_190._24_4_ = local_190._28_4_;
        local_190._28_4_ = uVar22;
        pSVar27 = (SPIRType *)local_190;
      }
    }
  }
LAB_00225461:
  BVar15 = pSVar17->basetype;
  if ((BVar15 == Image) && ((pSVar17->image).sampled == 2)) {
    if (((this->msl_options).platform == iOS) &&
       ((int)(this->msl_options).argument_buffers_tier < 1)) {
      bVar12 = Compiler::has_decoration((Compiler *)this,id,DecorationNonWritable);
      if (!bVar12) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (this_00,"Writable images are not allowed on Tier1 argument buffers on iOS.");
LAB_00225dd9:
        *(undefined ***)this_00 = &PTR__runtime_error_0035bd08;
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      BVar15 = pSVar17->basetype;
      goto LAB_002254af;
    }
    local_398 = &array_type.field_2;
    array_type._M_string_length = 0;
    array_type.field_2._M_local_buf[0] = '\0';
    array_type._M_dataplus._M_p = (pointer)local_398;
  }
  else {
LAB_002254af:
    local_398 = &array_type.field_2;
    array_type._M_string_length = 0;
    array_type.field_2._M_local_buf[0] = '\0';
    array_type._M_dataplus._M_p = (pointer)local_398;
    if (2 < BVar15 - Image) {
      decl_type._M_dataplus._M_p._0_4_ = 0x7fffffff;
      uVar29 = (ulong)(this->stage_out_var_id).id;
      if (uVar29 == 0) {
LAB_00225519:
        uVar29 = (ulong)(this->stage_in_var_id).id;
        if (uVar29 != 0) {
          pSVar20 = Variant::get<spirv_cross::SPIRVariable>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + uVar29);
          pSVar21 = Compiler::get_variable_data_type((Compiler *)this,pSVar20);
          if (((pSVar21->super_IVariant).self.id == (type->super_IVariant).self.id) &&
             (bVar12 = variable_storage_requires_stage_io(this,StorageClassInput), bVar12))
          goto LAB_0022556a;
        }
        EVar16 = Compiler::get_execution_model((Compiler *)this);
        if (EVar16 == ExecutionModelMeshEXT) goto LAB_0022556a;
      }
      else {
        pSVar20 = Variant::get<spirv_cross::SPIRVariable>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + uVar29);
        pSVar21 = Compiler::get_variable_data_type((Compiler *)this,pSVar20);
        if (((pSVar21->super_IVariant).self.id != (type->super_IVariant).self.id) ||
           ((this->capture_output_to_buffer & 1U) != 0)) goto LAB_00225519;
LAB_0022556a:
        bVar12 = Compiler::is_member_builtin((Compiler *)this,type,index,(BuiltIn *)&decl_type);
        if (bVar12) {
          this->is_using_builtin_array = true;
        }
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (&base_type,this,pSVar17,(ulong)id.id);
      ::std::__cxx11::string::operator=((string *)&array_type,(string *)&base_type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)base_type._M_dataplus._M_p != &base_type.field_2) {
        operator_delete(base_type._M_dataplus._M_p);
      }
    }
  }
  EVar16 = Compiler::get_execution_model((Compiler *)this);
  if (EVar16 == ExecutionModelMeshEXT) {
    __str_1._M_dataplus._M_p._0_4_ = 0x7fffffff;
    bVar12 = Compiler::is_member_builtin((Compiler *)this,type,index,(BuiltIn *)&__str_1);
    if (bVar12) {
      if ((uint)__str_1._M_dataplus._M_p == 0x1150) {
        this->is_using_builtin_array = false;
        (local_390->_M_dataplus)._M_p = (pointer)&local_390->field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"");
        goto LAB_002259bc;
      }
      SPIRType::SPIRType((SPIRType *)&base_type,pSVar27);
      if (((uint)__str_1._M_dataplus._M_p < 0xb) &&
         ((0x680U >> ((uint)__str_1._M_dataplus._M_p & 0x1f) & 1) != 0)) {
        uVar22 = 8;
LAB_00225af1:
        base_type.field_2._M_allocated_capacity._0_4_ = uVar22;
      }
      else {
        uVar22 = 2;
        if ((uint)__str_1._M_dataplus._M_p == 0x14b3) goto LAB_00225af1;
      }
      this->is_using_builtin_array = true;
      (local_390->_M_dataplus)._M_p = (pointer)&local_390->field_2;
      local_390->_M_string_length = 0;
      (local_390->field_2)._M_local_buf[0] = '\0';
      bVar11 = Compiler::has_member_decoration
                         ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,id.id,
                          DecorationBuiltIn);
      if (bVar11) {
        type_to_glsl_abi_cxx11_(&local_3d8,this,(SPIRType *)&base_type,id.id,false);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                  (&overlapping_binding_tag,this,(ulong)__str_1._M_dataplus._M_p & 0xffffffff,3);
        member_attribute_qualifier_abi_cxx11_(&__str,this,type,index);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                  (&decl_type,(spirv_cross *)&local_3d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb1d1,
                   (char (*) [2])qualifier,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &overlapping_binding_tag,&__str,&array_type,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d3bdb,
                   (char (*) [2])decl_type._M_dataplus._M_p);
        ::std::__cxx11::string::operator=((string *)local_390,(string *)&decl_type);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
          operator_delete(decl_type._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)overlapping_binding_tag != &local_3a8) {
          operator_delete(overlapping_binding_tag);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
LAB_00225cf3:
          operator_delete(local_3d8._M_dataplus._M_p);
        }
      }
      else {
        type_to_glsl_abi_cxx11_(&local_3d8,this,(SPIRType *)&base_type,id.id,false);
        CompilerGLSL::to_member_name_abi_cxx11_
                  ((string *)&overlapping_binding_tag,&this->super_CompilerGLSL,type,index);
        member_attribute_qualifier_abi_cxx11_(&__str,this,type,index);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                  (&decl_type,(spirv_cross *)&local_3d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb1d1,
                   (char (*) [2])qualifier,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &overlapping_binding_tag,&__str,&array_type,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d3bdb,
                   (char (*) [2])decl_type._M_dataplus._M_p);
        ::std::__cxx11::string::operator=((string *)local_390,(string *)&decl_type);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
          operator_delete(decl_type._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)overlapping_binding_tag != &local_3a8) {
          operator_delete(overlapping_binding_tag);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) goto LAB_00225cf3;
      }
      this->is_using_builtin_array = false;
      base_type._M_dataplus._M_p = (pointer)&PTR__SPIRType_0035c188;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_1c8);
      local_218 = 0;
      if (local_220 != local_208) {
        free(local_220);
      }
      local_250 = 0;
      if (local_258 != local_240) {
        free(local_258);
      }
      local_290 = 0;
      if (local_298 != local_280) {
        free(local_298);
      }
      if (local_2d0 != local_2b8) {
        free(local_2d0);
      }
      goto LAB_002259bc;
    }
  }
  if (id.id != 0) {
    bVar12 = Compiler::is_pointer((Compiler *)this,pSVar27);
    pSVar17 = pSVar27;
    if (bVar12) {
      pSVar17 = Compiler::get_pointee_type((Compiler *)this,pSVar27);
    }
    bVar12 = Compiler::is_array((Compiler *)this,pSVar17);
    if ((bVar12) && (uVar14 = get_resource_array_size(this,pSVar17,id.id), uVar14 == 0)) {
      ::std::__cxx11::string::_M_replace
                ((ulong)&array_type,0,(char *)array_type._M_string_length,0x2d0cf2);
    }
  }
  paVar1 = &decl_type.field_2;
  decl_type._M_string_length = 0;
  decl_type.field_2._M_allocated_capacity =
       decl_type.field_2._M_allocated_capacity & 0xffffffffffffff00;
  decl_type._M_dataplus._M_p = (pointer)paVar1;
  if (pSVar27->vecsize < 5) {
    type_to_glsl_abi_cxx11_(&base_type,this,pSVar27,id.id,true);
    ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&base_type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)base_type._M_dataplus._M_p != &base_type.field_2) {
      operator_delete(base_type._M_dataplus._M_p);
    }
  }
  else {
    pSVar17 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + member_type_id);
    SPIRType::SPIRType((SPIRType *)&base_type,pSVar17);
    bVar12 = Compiler::is_matrix((Compiler *)this,(SPIRType *)&base_type);
    if ((bVar11 & bVar12) == 1) {
      base_type.field_2._8_4_ = base_type.field_2._12_4_;
    }
    base_type.field_2._12_4_ = 1;
    ts_2 = (char (*) [2])0x1;
    type_to_glsl_abi_cxx11_(&local_3d8,this,(SPIRType *)&base_type,id.id,true);
    ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p);
    }
    if (pSVar27->columns < 2) {
      join<char_const(&)[17],std::__cxx11::string&,char_const(&)[2]>
                (&local_3d8,(spirv_cross *)"spvPaddedStd140<",(char (*) [17])&decl_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d188a,ts_2)
      ;
      ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3d8);
    }
    else {
      join<char_const(&)[23],std::__cxx11::string&,char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                (&local_3d8,(spirv_cross *)"spvPaddedStd140Matrix<",(char (*) [23])&decl_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d07c3,
                 (char (*) [3])&pSVar27->columns,(uint *)0x2d188a,
                 (char (*) [2])decl_type._M_dataplus._M_p);
      ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p);
    }
    base_type._M_dataplus._M_p = (pointer)&PTR__SPIRType_0035c188;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1c8);
    local_218 = 0;
    if (local_220 != local_208) {
      free(local_220);
    }
    local_250 = 0;
    if (local_258 != local_240) {
      free(local_258);
    }
    local_290 = 0;
    if (local_298 != local_280) {
      free(local_298);
    }
    if (local_2d0 != local_2b8) {
      free(local_2d0);
    }
  }
  bVar11 = Compiler::has_extended_member_decoration
                     ((Compiler *)this,(type->super_IVariant).self.id,index,
                      SPIRVCrossDecorationOverlappingBinding);
  overlapping_binding_tag = "";
  if (bVar11) {
    overlapping_binding_tag = "// Overlapping binding: ";
  }
  CompilerGLSL::to_member_name_abi_cxx11_(&base_type,&this->super_CompilerGLSL,type,index);
  member_attribute_qualifier_abi_cxx11_(&local_3d8,this,type,index);
  join<char_const*&,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (local_390,(spirv_cross *)&overlapping_binding_tag,(char **)&pack_pfx,&decl_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb1d1,
             (char (*) [2])qualifier,&base_type,&local_3d8,&array_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d3bdb,
             (char (*) [2])decl_type._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base_type._M_dataplus._M_p != &base_type.field_2) {
    operator_delete(base_type._M_dataplus._M_p);
  }
  this->is_using_builtin_array = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl_type._M_dataplus._M_p != paVar1) {
    operator_delete(decl_type._M_dataplus._M_p);
  }
LAB_002259bc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)array_type._M_dataplus._M_p != local_398) {
    operator_delete(array_type._M_dataplus._M_p);
  }
  local_190._0_8_ = &PTR__SPIRType_0035c188;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_68);
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_c0.super_VectorView<unsigned_int>.ptr !=
      &local_c0.stack_storage) {
    free(local_c0.super_VectorView<unsigned_int>.ptr);
  }
  local_190._160_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_190._152_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_190 + 0xb0)) {
    free((void *)local_190._152_8_);
  }
  local_190._96_8_ = 0;
  if ((undefined1 *)local_190._88_8_ != local_190 + 0x70) {
    free((void *)local_190._88_8_);
  }
  local_190._40_8_ = 0;
  if ((undefined1 *)local_190._32_8_ != local_190 + 0x38) {
    free((void *)local_190._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pack_pfx._M_dataplus._M_p != &pack_pfx.field_2) {
    operator_delete(pack_pfx._M_dataplus._M_p);
  }
  return local_390;
}

Assistant:

string CompilerMSL::to_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier)
{
	uint32_t orig_member_type_id = member_type_id;
	if (member_is_remapped_physical_type(type, index))
		member_type_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &physical_type = get<SPIRType>(member_type_id);

	// If this member is packed, mark it as so.
	string pack_pfx;

	// Allow Metal to use the array<T> template to make arrays a value type
	uint32_t orig_id = 0;
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID))
		orig_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID);

	bool row_major = false;
	if (is_matrix(physical_type))
		row_major = has_member_decoration(type.self, index, DecorationRowMajor);

	SPIRType row_major_physical_type { OpTypeMatrix };
	const SPIRType *declared_type = &physical_type;

	// If a struct is being declared with physical layout,
	// do not use array<T> wrappers.
	// This avoids a lot of complicated cases with packed vectors and matrices,
	// and generally we cannot copy full arrays in and out of buffers into Function
	// address space.
	// Array of resources should also be declared as builtin arrays.
	if (has_member_decoration(type.self, index, DecorationOffset))
		is_using_builtin_array = true;
	else if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
		is_using_builtin_array = true;

	if (member_is_packed_physical_type(type, index))
	{
		// If we're packing a matrix, output an appropriate typedef
		if (physical_type.basetype == SPIRType::Struct)
		{
			SPIRV_CROSS_THROW("Cannot emit a packed struct currently.");
		}
		else if (is_matrix(physical_type))
		{
			uint32_t rows = physical_type.vecsize;
			uint32_t cols = physical_type.columns;
			pack_pfx = "packed_";
			if (row_major)
			{
				// These are stored transposed.
				rows = physical_type.columns;
				cols = physical_type.vecsize;
				pack_pfx = "packed_rm_";
			}
			string base_type = physical_type.width == 16 ? "half" : "float";
			string td_line = "typedef ";
			td_line += "packed_" + base_type + to_string(rows);
			td_line += " " + pack_pfx;
			// Use the actual matrix size here.
			td_line += base_type + to_string(physical_type.columns) + "x" + to_string(physical_type.vecsize);
			td_line += "[" + to_string(cols) + "]";
			td_line += ";";
			add_typedef_line(td_line);
		}
		else if (!is_scalar(physical_type)) // scalar type is already packed.
			pack_pfx = "packed_";
	}
	else if (is_matrix(physical_type))
	{
		if (!msl_options.supports_msl_version(3, 0) &&
		    has_extended_decoration(type.self, SPIRVCrossDecorationWorkgroupStruct))
		{
			pack_pfx = "spvStorage_";
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			// The pack prefix causes problems with array<T> wrappers.
			is_using_builtin_array = true;
		}
		if (row_major)
		{
			// Need to declare type with flipped vecsize/columns.
			row_major_physical_type = physical_type;
			swap(row_major_physical_type.vecsize, row_major_physical_type.columns);
			declared_type = &row_major_physical_type;
		}
	}

	// iOS Tier 1 argument buffers do not support writable images.
	if (physical_type.basetype == SPIRType::Image &&
		physical_type.image.sampled == 2 &&
		msl_options.is_ios() &&
		msl_options.argument_buffers_tier <= Options::ArgumentBuffersTier::Tier1 &&
		!has_decoration(orig_id, DecorationNonWritable))
	{
		SPIRV_CROSS_THROW("Writable images are not allowed on Tier1 argument buffers on iOS.");
	}

	// Array information is baked into these types.
	string array_type;
	if (physical_type.basetype != SPIRType::Image && physical_type.basetype != SPIRType::Sampler &&
	    physical_type.basetype != SPIRType::SampledImage)
	{
		BuiltIn builtin = BuiltInMax;

		// Special handling. In [[stage_out]] or [[stage_in]] blocks,
		// we need flat arrays, but if we're somehow declaring gl_PerVertex for constant array reasons, we want
		// template array types to be declared.
		bool is_ib_in_out =
				((stage_out_var_id && get_stage_out_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassOutput)) ||
				 (stage_in_var_id && get_stage_in_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassInput))) ||
				is_mesh_shader();
		if (is_ib_in_out && is_member_builtin(type, index, &builtin))
			is_using_builtin_array = true;
		array_type = type_to_array_glsl(physical_type, orig_id);
	}

	if (is_mesh_shader())
	{
		BuiltIn builtin = BuiltInMax;
		if (is_member_builtin(type, index, &builtin))
		{
			if (builtin == BuiltInPrimitiveShadingRateKHR)
			{
				// not supported in metal 3.0
				is_using_builtin_array = false;
				return "";
			}

			SPIRType metallic_type = *declared_type;
			if (builtin == BuiltInCullPrimitiveEXT)
				metallic_type.basetype = SPIRType::Boolean;
			else if (builtin == BuiltInPrimitiveId || builtin == BuiltInLayer || builtin == BuiltInViewportIndex)
				metallic_type.basetype = SPIRType::UInt;

			is_using_builtin_array = true;
			std::string result;
			if (has_member_decoration(type.self, orig_id, DecorationBuiltIn))
			{
				// avoid '_RESERVED_IDENTIFIER_FIXUP_' in variable name
				result = join(type_to_glsl(metallic_type, orig_id, false), " ", qualifier,
				              builtin_to_glsl(builtin, StorageClassOutput), member_attribute_qualifier(type, index),
				              array_type, ";");
			}
			else
			{
				result = join(type_to_glsl(metallic_type, orig_id, false), " ", qualifier,
				              to_member_name(type, index), member_attribute_qualifier(type, index), array_type, ";");
			}
			is_using_builtin_array = false;
			return result;
		}
	}

	if (orig_id)
	{
		auto *data_type = declared_type;
		if (is_pointer(*data_type))
			data_type = &get_pointee_type(*data_type);

		if (is_array(*data_type) && get_resource_array_size(*data_type, orig_id) == 0)
		{
			// Hack for declaring unsized array of resources. Need to declare dummy sized array by value inline.
			// This can then be wrapped in spvDescriptorArray as usual.
			array_type = "[1] /* unsized array hack */";
		}
	}

	string decl_type;
	if (declared_type->vecsize > 4)
	{
		auto orig_type = get<SPIRType>(orig_member_type_id);
		if (is_matrix(orig_type) && row_major)
			swap(orig_type.vecsize, orig_type.columns);
		orig_type.columns = 1;
		decl_type = type_to_glsl(orig_type, orig_id, true);

		if (declared_type->columns > 1)
			decl_type = join("spvPaddedStd140Matrix<", decl_type, ", ", declared_type->columns, ">");
		else
			decl_type = join("spvPaddedStd140<", decl_type, ">");
	}
	else
		decl_type = type_to_glsl(*declared_type, orig_id, true);

	const char *overlapping_binding_tag =
			has_extended_member_decoration(type.self, index, SPIRVCrossDecorationOverlappingBinding) ?
			"// Overlapping binding: " : "";

	auto result = join(overlapping_binding_tag, pack_pfx, decl_type, " ", qualifier,
	                   to_member_name(type, index), member_attribute_qualifier(type, index), array_type, ";");

	is_using_builtin_array = false;
	return result;
}